

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet.cpp
# Opt level: O0

void __thiscall cppnet::CppNet::~CppNet(CppNet *this)

{
  bool bVar1;
  element_type *this_00;
  CppNet *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    CppNetBase::Dealloc(this_00);
  }
  std::shared_ptr<cppnet::CppNetBase>::~shared_ptr(&this->_cppnet_base);
  return;
}

Assistant:

CppNet::~CppNet() {
    if (_cppnet_base) {
        _cppnet_base->Dealloc();
    }
}